

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_importSourceNotEqualImportSource_Test::~Equality_importSourceNotEqualImportSource_Test
          (Equality_importSourceNotEqualImportSource_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, importSourceNotEqualImportSource)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("bob");
    libcellml::ComponentPtr c2 = libcellml::Component::create("bob");

    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();
    is1->setUrl("a_great_url");

    c1->setImportSource(is1);

    EXPECT_FALSE(c1->equals(c2));
}